

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * quoteIfNeeded(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  size_type *psVar7;
  string output;
  string local_80;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  long *local_40 [2];
  long local_30 [2];
  
  uVar3 = std::__cxx11::string::find((char)input,0x22);
  uVar4 = std::__cxx11::string::find((char)input,0x20);
  uVar5 = std::__cxx11::string::find_first_of((char *)input,0x17ba04,0);
  if ((uVar5 & uVar4 & uVar3) == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  }
  else {
    local_58 = 0;
    local_50 = 0;
    local_60 = &local_50;
    if (uVar3 == 0xffffffffffffffff) {
      std::__cxx11::string::_M_assign((string *)&local_60);
    }
    else {
      escape(&local_80,input,0x22);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\"","");
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_40,(ulong)local_60);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_80.field_2._M_allocated_capacity = *psVar7;
      local_80.field_2._8_8_ = plVar6[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar7;
      local_80._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_80._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar2 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string quoteIfNeeded (const std::string& input)
{
  auto quote = input.find ('"');
  auto space = input.find (' ');
  auto op    = input.find_first_of ("-+/()<^!=~_%");

  if (quote == std::string::npos &&
      space == std::string::npos &&
      op    == std::string::npos)
  {
    return input;
  }

  std::string output;
  if (quote != std::string::npos)
  {
    output = escape (input, '"');
  }
  else
  {
    output = input;
  }

  return std::string ("\"") + output + "\"";
}